

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O1

void caffe::UpgradeNetInput(NetParameter *net_param)

{
  RepeatedPtrField<caffe::LayerParameter> *this;
  byte *pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  int iVar4;
  RepeatedPtrFieldBase *this_00;
  LayerParameter *this_01;
  Type *pTVar5;
  InputParameter *this_02;
  Type *value;
  Type *pTVar6;
  Type *from;
  int *piVar7;
  Type *other;
  int index;
  uint uVar8;
  ulong uVar9;
  int j;
  int iVar10;
  string local_80;
  RepeatedPtrFieldBase *local_60;
  RepeatedPtrFieldBase *local_58;
  RepeatedPtrFieldBase *local_50;
  RepeatedPtrFieldBase *local_48;
  LayerParameter *local_40;
  ulong local_38;
  
  iVar10 = (net_param->input_shape_).super_RepeatedPtrFieldBase.current_size_;
  if ((0 < iVar10) || (0 < (net_param->input_dim_).current_size_)) {
    this = &net_param->layer_;
    pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
             Add<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                       (&this->super_RepeatedPtrFieldBase,(Type *)0x0);
    *(byte *)(pTVar5->_has_bits_).has_bits_ = (byte)(pTVar5->_has_bits_).has_bits_[0] | 1;
    paVar2 = &local_80.field_2;
    local_80._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"input","");
    google::protobuf::internal::ArenaStringPtr::SetNoArena
              (&pTVar5->name_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               &local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    *(byte *)(pTVar5->_has_bits_).has_bits_ = (byte)(pTVar5->_has_bits_).has_bits_[0] | 2;
    local_80._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Input","");
    google::protobuf::internal::ArenaStringPtr::SetNoArena
              (&pTVar5->type_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               &local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    pbVar1 = (byte *)((long)(pTVar5->_has_bits_).has_bits_ + 5);
    *pbVar1 = *pbVar1 | 0x20;
    if (pTVar5->input_param_ == (InputParameter *)0x0) {
      this_02 = (InputParameter *)operator_new(0x30);
      InputParameter::InputParameter(this_02);
      pTVar5->input_param_ = this_02;
    }
    local_58 = &this->super_RepeatedPtrFieldBase;
    if (0 < (net_param->input_).super_RepeatedPtrFieldBase.current_size_) {
      local_48 = &(net_param->input_).super_RepeatedPtrFieldBase;
      local_60 = &(pTVar5->input_param_->shape_).super_RepeatedPtrFieldBase;
      local_50 = &(net_param->input_shape_).super_RepeatedPtrFieldBase;
      uVar9 = 0;
      local_40 = pTVar5;
      do {
        this_01 = local_40;
        index = (int)uVar9;
        value = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (local_48,index);
        LayerParameter::add_top(this_01,value);
        local_38 = uVar9;
        if (iVar10 < 1) {
          pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Add<google::protobuf::RepeatedPtrField<caffe::BlobShape>::TypeHandler>
                             (local_60,(Type *)0x0);
          uVar8 = index * 4;
          do {
            piVar7 = google::protobuf::RepeatedField<int>::Get(&net_param->input_dim_,uVar8);
            iVar3 = *piVar7;
            iVar4 = (pTVar6->dim_).total_size_;
            if ((pTVar6->dim_).current_size_ == iVar4) {
              google::protobuf::RepeatedField<long>::Reserve(&pTVar6->dim_,iVar4 + 1);
            }
            iVar4 = (pTVar6->dim_).current_size_;
            (pTVar6->dim_).current_size_ = iVar4 + 1;
            ((pTVar6->dim_).rep_)->elements[iVar4] = (long)iVar3;
            uVar8 = uVar8 + 1;
          } while (uVar8 < index * 4 + 4U);
        }
        else {
          pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Add<google::protobuf::RepeatedPtrField<caffe::BlobShape>::TypeHandler>
                             (local_60,(Type *)0x0);
          from = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<caffe::BlobShape>::TypeHandler>
                           (local_50,index);
          BlobShape::CopyFrom(pTVar6,from);
        }
        uVar8 = (int)local_38 + 1;
        uVar9 = (ulong)uVar8;
      } while ((int)uVar8 < (net_param->input_).super_RepeatedPtrFieldBase.current_size_);
    }
    this_00 = local_58;
    iVar10 = (net_param->layer_).super_RepeatedPtrFieldBase.current_size_;
    if (1 < iVar10) {
      iVar10 = iVar10 + 1;
      do {
        pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Mutable<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                           (this_00,iVar10 + -3);
        other = google::protobuf::internal::RepeatedPtrFieldBase::
                Mutable<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                          (this_00,iVar10 + -2);
        LayerParameter::Swap(pTVar5,other);
        iVar10 = iVar10 + -1;
      } while (2 < iVar10);
    }
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(net_param->input_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<caffe::BlobShape>::TypeHandler>
            (&(net_param->input_shape_).super_RepeatedPtrFieldBase);
  (net_param->input_dim_).current_size_ = 0;
  return;
}

Assistant:

void UpgradeNetInput(NetParameter* net_param) {
  // Collect inputs and convert to Input layer definitions.
  // If the NetParameter holds an input alone, without shape/dim, then
  // it's a legacy caffemodel and simply stripping the input field is enough.
  bool has_shape = net_param->input_shape_size() > 0;
  bool has_dim = net_param->input_dim_size() > 0;
  if (has_shape || has_dim) {
    LayerParameter* layer_param = net_param->add_layer();
    layer_param->set_name("input");
    layer_param->set_type("Input");
    InputParameter* input_param = layer_param->mutable_input_param();
    // Convert input fields into a layer.
    for (int i = 0; i < net_param->input_size(); ++i) {
      layer_param->add_top(net_param->input(i));
      if (has_shape) {
        input_param->add_shape()->CopyFrom(net_param->input_shape(i));
      } else {
        // Turn legacy input dimensions into shape.
        BlobShape* shape = input_param->add_shape();
        int first_dim = i*4;
        int last_dim = first_dim + 4;
        for (int j = first_dim; j < last_dim; j++) {
          shape->add_dim(net_param->input_dim(j));
        }
      }
    }
    // Swap input layer to beginning of net to satisfy layer dependencies.
    for (int i = net_param->layer_size() - 1; i > 0; --i) {
      net_param->mutable_layer(i-1)->Swap(net_param->mutable_layer(i));
    }
  }
  // Clear inputs.
  net_param->clear_input();
  net_param->clear_input_shape();
  net_param->clear_input_dim();
}